

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

void phosg::save_file(string *filename,void *data,size_t size)

{
  uint uVar1;
  size_t sVar2;
  uint *puVar3;
  runtime_error *this;
  int error;
  scoped_fd fd;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  scoped_fd::scoped_fd(&fd,filename,0x241,0x1ed);
  sVar2 = write(fd.fd,data,size);
  if (sVar2 == size) {
    scoped_fd::~scoped_fd(&fd);
    return;
  }
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  if (uVar1 == 0) {
    string_printf_abi_cxx11_
              (&local_b0,"can\'t write to %s: %zd/%zd bytes written",(filename->_M_dataplus)._M_p,
               sVar2,size);
    ::std::runtime_error::runtime_error(this,(string *)&local_b0);
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::operator+(&local_70,"can\'t write to ",filename);
  ::std::operator+(&local_50,&local_70,": ");
  string_for_error_abi_cxx11_(&local_90,(phosg *)(ulong)*puVar3,error);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   &local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  ::std::runtime_error::runtime_error(this,(string *)&local_b0);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void save_file(const string& filename, const void* data, size_t size) {
  scoped_fd fd(filename, O_CREAT | O_TRUNC | O_WRONLY);
  ssize_t bytes_written = write(fd, data, size);
  if (bytes_written != static_cast<ssize_t>(size)) {
    if (errno == 0) {
      throw runtime_error(string_printf("can\'t write to %s: %zd/%zd bytes written",
          filename.c_str(), bytes_written, size));
    } else {
      throw runtime_error("can\'t write to " + filename + ": " + string_for_error(errno));
    }
  }
}